

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuantizedBvh.cpp
# Opt level: O0

void __thiscall
btQuantizedBvh::updateSubtreeHeaders
          (btQuantizedBvh *this,int leftChildNodexIndex,int rightChildNodexIndex)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  btBvhSubtreeInfo *subtree_1;
  btBvhSubtreeInfo *subtree;
  int rightSubTreeSizeInBytes;
  int rightSubTreeSize;
  btQuantizedBvhNode *rightChildNode;
  int leftSubTreeSizeInBytes;
  int leftSubTreeSize;
  btQuantizedBvhNode *leftChildNode;
  btBvhSubtreeInfo *in_stack_ffffffffffffff68;
  btBvhSubtreeInfo local_80;
  btBvhSubtreeInfo *local_60;
  btBvhSubtreeInfo local_58;
  btBvhSubtreeInfo *local_38;
  int local_30;
  int local_2c;
  btQuantizedBvhNode *local_28;
  int local_20;
  int local_1c;
  btQuantizedBvhNode *local_18;
  int local_10;
  int local_c;
  
  local_10 = in_EDX;
  local_c = in_ESI;
  local_18 = btAlignedObjectArray<btQuantizedBvhNode>::operator[]
                       ((btAlignedObjectArray<btQuantizedBvhNode> *)(in_RDI + 0xa8),in_ESI);
  bVar1 = btQuantizedBvhNode::isLeafNode(local_18);
  if (bVar1) {
    iVar2 = 1;
  }
  else {
    iVar2 = btQuantizedBvhNode::getEscapeIndex(local_18);
  }
  local_20 = iVar2 << 4;
  local_1c = iVar2;
  local_28 = btAlignedObjectArray<btQuantizedBvhNode>::operator[]
                       ((btAlignedObjectArray<btQuantizedBvhNode> *)(in_RDI + 0xa8),local_10);
  bVar1 = btQuantizedBvhNode::isLeafNode(local_28);
  if (bVar1) {
    iVar3 = 1;
  }
  else {
    iVar3 = btQuantizedBvhNode::getEscapeIndex(local_28);
  }
  local_30 = iVar3 << 4;
  local_2c = iVar3;
  if (local_20 < 0x801) {
    in_stack_ffffffffffffff68 = (btBvhSubtreeInfo *)(in_RDI + 0xd0);
    btBvhSubtreeInfo::btBvhSubtreeInfo(&local_58);
    local_38 = btAlignedObjectArray<btBvhSubtreeInfo>::expand
                         ((btAlignedObjectArray<btBvhSubtreeInfo> *)CONCAT44(iVar2,iVar3),
                          in_stack_ffffffffffffff68);
    btBvhSubtreeInfo::setAabbFromQuantizeNode(local_38,local_18);
    local_38->m_rootNodeIndex = local_c;
    local_38->m_subtreeSize = local_1c;
  }
  if (local_30 < 0x801) {
    btBvhSubtreeInfo::btBvhSubtreeInfo(&local_80);
    local_60 = btAlignedObjectArray<btBvhSubtreeInfo>::expand
                         ((btAlignedObjectArray<btBvhSubtreeInfo> *)CONCAT44(iVar2,iVar3),
                          in_stack_ffffffffffffff68);
    btBvhSubtreeInfo::setAabbFromQuantizeNode(local_60,local_28);
    local_60->m_rootNodeIndex = local_10;
    local_60->m_subtreeSize = local_2c;
  }
  iVar2 = btAlignedObjectArray<btBvhSubtreeInfo>::size
                    ((btAlignedObjectArray<btBvhSubtreeInfo> *)(in_RDI + 0xd0));
  *(int *)(in_RDI + 0xf0) = iVar2;
  return;
}

Assistant:

void	btQuantizedBvh::updateSubtreeHeaders(int leftChildNodexIndex,int rightChildNodexIndex)
{
	btAssert(m_useQuantization);

	btQuantizedBvhNode& leftChildNode = m_quantizedContiguousNodes[leftChildNodexIndex];
	int leftSubTreeSize = leftChildNode.isLeafNode() ? 1 : leftChildNode.getEscapeIndex();
	int leftSubTreeSizeInBytes =  leftSubTreeSize * static_cast<int>(sizeof(btQuantizedBvhNode));
	
	btQuantizedBvhNode& rightChildNode = m_quantizedContiguousNodes[rightChildNodexIndex];
	int rightSubTreeSize = rightChildNode.isLeafNode() ? 1 : rightChildNode.getEscapeIndex();
	int rightSubTreeSizeInBytes =  rightSubTreeSize *  static_cast<int>(sizeof(btQuantizedBvhNode));

	if(leftSubTreeSizeInBytes <= MAX_SUBTREE_SIZE_IN_BYTES)
	{
		btBvhSubtreeInfo& subtree = m_SubtreeHeaders.expand();
		subtree.setAabbFromQuantizeNode(leftChildNode);
		subtree.m_rootNodeIndex = leftChildNodexIndex;
		subtree.m_subtreeSize = leftSubTreeSize;
	}

	if(rightSubTreeSizeInBytes <= MAX_SUBTREE_SIZE_IN_BYTES)
	{
		btBvhSubtreeInfo& subtree = m_SubtreeHeaders.expand();
		subtree.setAabbFromQuantizeNode(rightChildNode);
		subtree.m_rootNodeIndex = rightChildNodexIndex;
		subtree.m_subtreeSize = rightSubTreeSize;
	}

	//PCK: update the copy of the size
	m_subtreeHeaderCount = m_SubtreeHeaders.size();
}